

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_mvpcontrol_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint local_1c;
  uint32_t newval;
  uint32_t mask;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  local_1c = 0;
  if ((env->CP0_VPEConf0 & 2U) != 0) {
    local_1c = 0xb;
  }
  if ((env->mvp->CP0_MVPControl & 2U) != 0) {
    local_1c = local_1c | 4;
  }
  env->mvp->CP0_MVPControl =
       env->mvp->CP0_MVPControl & (local_1c ^ 0xffffffff) | (uint)arg1 & local_1c;
  return;
}

Assistant:

void helper_mtc0_mvpcontrol(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = 0;
    uint32_t newval;

    if (env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) {
        mask |= (1 << CP0MVPCo_CPA) | (1 << CP0MVPCo_VPC) |
                (1 << CP0MVPCo_EVP);
    }
    if (env->mvp->CP0_MVPControl & (1 << CP0MVPCo_VPC)) {
        mask |= (1 << CP0MVPCo_STLB);
    }
    newval = (env->mvp->CP0_MVPControl & ~mask) | (arg1 & mask);

    /* TODO: Enable/disable shared TLB, enable/disable VPEs. */

    env->mvp->CP0_MVPControl = newval;
}